

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::PlotErrorBars<double>
               (char *label_id,double *xs,double *ys,double *err,int count,int offset,int stride)

{
  GetterError<double> local_30;
  
  if (count == 0) {
    local_30.Offset = 0;
  }
  else {
    local_30.Offset = (offset % count + count) % count;
  }
  local_30.Stride = stride;
  local_30.Xs = xs;
  local_30.Ys = ys;
  local_30.Neg = err;
  local_30.Pos = err;
  local_30.Count = count;
  PlotErrorBarsEx<ImPlot::GetterError<double>>(label_id,&local_30);
  return;
}

Assistant:

void PlotErrorBars(const char* label_id, const T* xs, const T* ys, const T* err, int count, int offset, int stride) {
    GetterError<T> getter(xs, ys, err, err, count, offset, stride);
    PlotErrorBarsEx(label_id, getter);
}